

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tria_o1.cc
# Opt level: O3

void __thiscall lf::geometry::TriaO1::TriaO1(TriaO1 *this,Matrix<double,__1,_3,_0,__1,_3> *coords)

{
  Matrix<double,__1,_3,_0,__1,_3> *coords_00;
  Matrix<double,__1,_2,_0,__1,_2> *this_00;
  double *pdVar1;
  Matrix<double,__1,_2,_0,__1,_2> *this_01;
  Index IVar2;
  long lVar3;
  double *pdVar4;
  PointerType pdVar5;
  long lVar6;
  ActualDstType actualDst;
  Scalar SVar7;
  double dVar8;
  ActualDstType actualDst_2;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  scalar_difference_op<double,_double> local_241;
  undefined1 local_240 [16];
  Matrix<double,__1,_2,_0,__1,_2> *pMStack_230;
  Matrix<double,__1,_3,_0,__1,_3> *local_228;
  variable_if_dynamic<long,__1> local_220;
  variable_if_dynamic<long,__1> local_218;
  Index local_210;
  Rhs local_208;
  CommaInitializer<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> local_1c8;
  undefined1 local_1a8 [16];
  Matrix<double,_2,_2,_0,_2,_2> local_198;
  double *local_178;
  PointerType pdStack_170;
  variable_if_dynamic<long,__1> local_168;
  undefined8 local_160;
  non_const_type local_128;
  Matrix<double,__1,_2,_0,__1,_2> *pMStack_120;
  Lhs local_118;
  undefined1 local_e0 [24];
  Rhs *local_c8;
  Rhs local_68;
  
  (this->super_Geometry)._vptr_Geometry = (_func_int **)&PTR_DimLocal_00253d58;
  coords_00 = &this->coords_;
  (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.m_data =
       (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.m_data;
  (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.m_rows =
       (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.m_rows;
  (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.m_data =
       (double *)0x0;
  (coords->super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>).m_storage.m_rows = 0;
  this_00 = &this->jacobian_;
  IVar2 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
          m_rows;
  (this->jacobian_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage.m_data
       = (double *)0x0;
  (this->jacobian_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage.m_rows
       = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::resize
            (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,IVar2,2);
  this_01 = &this->jacobian_inverse_gramian_;
  IVar2 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
          m_rows;
  (this->jacobian_inverse_gramian_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.
  m_storage.m_data = (double *)0x0;
  (this->jacobian_inverse_gramian_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.
  m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::resize
            (&this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,IVar2,2);
  this->integrationElement_ = 0.0;
  assertNonDegenerateTriangle(coords_00,1e-08);
  IVar2 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
          m_rows;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0> *)
             local_240,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.
             m_storage.m_data + IVar2,IVar2,1);
  local_220.m_value = 0;
  local_218.m_value = 1;
  local_210 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.
              m_storage.m_rows;
  local_228 = coords_00;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0> *)
             &local_208,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.
             m_storage.m_data,local_210,1);
  local_208.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_startRow.
  m_value = 0;
  local_208.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_startCol.
  m_value = 0;
  local_208.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_outerStride =
       (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
       m_rows;
  local_208.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_xpr = coords_00
  ;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
                   *)local_1a8,(Lhs *)local_240,&local_208,
                  (scalar_difference_op<double,_double> *)local_e0);
  Eigen::CommaInitializer<Eigen::Matrix<double,-1,2,0,-1,2>>::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,_1,1,true>const>>
            ((CommaInitializer<Eigen::Matrix<double,_1,2,0,_1,2>> *)&local_1c8,this_00,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>
              *)local_1a8);
  IVar2 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
          m_rows;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0> *)
             &local_118,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.
             m_storage.m_data + IVar2 * 2,IVar2,1);
  local_118.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_startRow.
  m_value = 0;
  local_118.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_startCol.
  m_value = 2;
  local_118.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_outerStride =
       (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
       m_rows;
  local_118.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_xpr = coords_00
  ;
  Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0> *)
             &local_68,
             (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.
             m_storage.m_data,
             local_118.
             super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
             m_outerStride,1);
  local_68.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_startRow.
  m_value = 0;
  local_68.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_startCol.
  m_value = 0;
  local_68.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_outerStride =
       (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
       m_rows;
  local_68.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.m_xpr = coords_00
  ;
  Eigen::
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>_>
  ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
                   *)local_e0,&local_118,&local_68,&local_241);
  Eigen::CommaInitializer<Eigen::Matrix<double,-1,2,0,-1,2>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_1,2,0,_1,2>> *)&local_1c8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>
              *)local_e0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::finished(&local_1c8);
  if ((this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
      m_rows == 2) {
    local_e0._0_8_ = this_00;
    local_1a8._0_8_ =
         Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>_>::inverse
                   ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>_> *)
                    local_e0);
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(this_01,(SrcXprType *)local_1a8,(assign_op<double,_double> *)local_240);
    SVar7 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::determinant
                      ((MatrixBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)this_00);
    this->integrationElement_ = ABS(SVar7);
  }
  else {
    local_68.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>.m_data =
         (PointerType)this_00;
    Eigen::
    Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>,_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_0>
    ::Product((Product<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_0>
               *)local_1a8,(Lhs *)&local_68,this_00);
    local_128 = (non_const_type)local_1a8._0_8_;
    pMStack_120 = (Matrix<double,__1,_2,_0,__1,_2> *)local_1a8._8_8_;
    local_208.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>.m_data =
         (PointerType)0x0;
    local_208.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>.m_rows.
    m_value = 0;
    local_208.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>._16_8_ = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_208,
               (this->jacobian_).super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.
               m_storage.m_rows,2);
    local_240._8_8_ = local_128;
    pMStack_230 = pMStack_120;
    local_240._0_8_ = this_00;
    local_1a8._0_8_ = this_00;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>,_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_0>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&local_198,(SrcXprType *)(local_240 + 8),(assign_op<double,_double> *)local_e0);
    local_178 = (((PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)local_1a8._0_8_)->
                m_storage).m_data;
    pdStack_170 = (PointerType)
                  (((PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)local_1a8._0_8_)->
                  m_storage).m_rows;
    local_160 = 2;
    local_168.m_value = (long)&local_198;
    Eigen::internal::
    resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,2,0,_1,2>>,Eigen::Matrix<double,_1,2,0,_1,2>,0>>,1>,double,double>
              ((Matrix<double,__1,__1,_0,__1,__1> *)&local_208,
               (Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_0>_>,_1>
                *)local_240,(assign_op<double,_double> *)&local_1c8);
    local_118.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>.m_data =
         local_208.
         super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>.m_data;
    local_118.super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>.m_rows.
    m_value = local_208.
              super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1>.
              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>.
              m_rows.m_value;
    local_e0._8_8_ = local_1a8;
    local_e0._0_8_ = &local_118;
    local_e0._16_8_ = &local_1c8;
    local_c8 = &local_208;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>,_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_0>_>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_0>_>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)local_e0);
    pdVar5 = local_208.
             super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>.
             m_data;
    Eigen::internal::
    resize_if_allowed<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::Matrix<double,_1,_1,0,_1,_1>,double,double>
              (this_01,(Matrix<double,__1,__1,_0,__1,__1> *)&local_208,
               (assign_op<double,_double> *)local_1a8);
    lVar3 = (this->jacobian_inverse_gramian_).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage.m_rows;
    if (0 < lVar3) {
      pdVar4 = (this->jacobian_inverse_gramian_).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>.m_storage.m_data;
      lVar6 = 0;
      do {
        dVar8 = (pdVar5 + lVar6)[1];
        pdVar1 = pdVar4 + lVar6;
        *pdVar1 = pdVar5[lVar6];
        pdVar1[1] = dVar8;
        lVar6 = lVar6 + 2;
      } while (SBORROW8(lVar6,lVar3 * 2) != lVar6 + lVar3 * -2 < 0);
    }
    free(local_208.
         super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>.m_data)
    ;
    local_240._0_8_ = this_00;
    Eigen::
    Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>,_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_0>
    ::Product((Product<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_0>
               *)local_1a8,(Lhs *)local_240,this_00);
    local_e0._0_8_ = local_1a8._0_8_;
    local_e0._8_8_ = local_1a8._8_8_;
    Eigen::internal::
    generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,2,0,-1,2>>,Eigen::Matrix<double,-1,2,0,-1,2>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::evalTo<Eigen::Matrix<double,2,2,0,2,2>>
              ((Matrix<double,_2,_2,_0,_2,_2> *)local_1a8,
               (Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)local_e0,
               (Matrix<double,__1,_2,_0,__1,_2> *)local_1a8._8_8_);
    dVar8 = (double)local_1a8._0_8_ *
            local_198.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[1] -
            local_198.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[0] * (double)local_1a8._8_8_;
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    this->integrationElement_ = dVar8;
  }
  return;
}

Assistant:

TriaO1::TriaO1(Eigen::Matrix<double, Eigen::Dynamic, 3> coords)
    : coords_(std::move(coords)),
      jacobian_(coords_.rows(), 2),
      jacobian_inverse_gramian_(coords_.rows(), 2) {
  // Make sure that the triangle has a proper shape.
  assertNonDegenerateTriangle(coords_);
  // Precompute constant Jacobian
  jacobian_ << coords_.col(1) - coords_.col(0), coords_.col(2) - coords_.col(0);
  // Precompute constant metric factor
  if (coords_.rows() == 2) {
    jacobian_inverse_gramian_ = jacobian_.transpose().inverse();
    integrationElement_ = std::abs(jacobian_.determinant());
  } else {
    jacobian_inverse_gramian_ = Eigen::MatrixXd(
        jacobian_ * (jacobian_.transpose() * jacobian_).inverse());
    integrationElement_ =
        std::sqrt((jacobian_.transpose() * jacobian_).determinant());
  }
}